

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O2

STL * cacheSurface(STL *__return_storage_ptr__,ImportedUgrid *ugrid,
                  set<int,_std::less<int>,_std::allocator<int>_> *tags)

{
  pointer pdVar1;
  double dVar2;
  pointer piVar3;
  pointer pdVar4;
  double dVar5;
  vector<Parfait::Facet,_std::allocator<Parfait::Facet>_> *this;
  size_type sVar6;
  long lVar7;
  long lVar8;
  int q;
  long lVar9;
  double *pdVar10;
  Facet *pFVar11;
  int t;
  ulong uVar12;
  int *piVar13;
  byte bVar14;
  int tag;
  vector<Parfait::Facet,_std::allocator<Parfait::Facet>_> *local_150;
  set<int,_std::less<int>,_std::allocator<int>_> *local_148;
  double local_140;
  Facet local_138;
  double local_d8;
  double dStack_d0;
  int tag_1;
  undefined4 uStack_c4;
  double dStack_c0;
  double local_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  double local_88 [2];
  array<Parfait::Point<double>,_3UL> facet;
  
  bVar14 = 0;
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  local_150 = &__return_storage_ptr__->facets;
  (__return_storage_ptr__->facets).
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->facets).
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->facets).
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar9 = 0;
  uVar12 = 0;
  local_148 = tags;
  while( true ) {
    this = local_150;
    piVar3 = (ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar3 >> 2) / 3 <= uVar12) break;
    tag = (ugrid->triangleTags).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12];
    sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(local_148,&tag);
    if (sVar6 != 0) {
      pdVar4 = (ugrid->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar13 = (int *)((long)piVar3 + lVar9);
      for (lVar7 = 4; lVar7 != 0x16; lVar7 = lVar7 + 6) {
        dVar2 = pdVar4[(long)*piVar13 * 3 + 2];
        pdVar1 = pdVar4 + (long)*piVar13 * 3;
        dVar5 = pdVar1[1];
        *(double *)((long)local_88 + lVar7 * 4) = *pdVar1;
        *(double *)((long)local_88 + lVar7 * 4 + 8) = dVar5;
        *(double *)((long)facet._M_elems[0].pos._M_elems + lVar7 * 4) = dVar2;
        piVar13 = piVar13 + 1;
      }
      local_b8 = facet._M_elems[0].pos._M_elems[2];
      _tag_1 = facet._M_elems[0].pos._M_elems[0];
      dStack_c0 = facet._M_elems[0].pos._M_elems[1];
      local_a0 = facet._M_elems[1].pos._M_elems[2];
      local_b0 = facet._M_elems[1].pos._M_elems[0];
      dStack_a8 = facet._M_elems[1].pos._M_elems[1];
      local_88[0] = facet._M_elems[2].pos._M_elems[2];
      local_98 = facet._M_elems[2].pos._M_elems[0];
      dStack_90 = facet._M_elems[2].pos._M_elems[1];
      pdVar10 = (double *)&tag_1;
      pFVar11 = &local_138;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pFVar11->points)._M_elems[0].pos._M_elems[0] = *pdVar10;
        pdVar10 = pdVar10 + (ulong)bVar14 * -2 + 1;
        pFVar11 = (Facet *)((long)pFVar11 + (ulong)bVar14 * -0x10 + 8);
      }
      std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::emplace_back<Parfait::Facet>
                (local_150,&local_138);
    }
    uVar12 = uVar12 + 1;
    lVar9 = lVar9 + 0xc;
  }
  lVar9 = 8;
  for (uVar12 = 0;
      piVar3 = (ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar3 >> 2) >> 2;
      uVar12 = uVar12 + 1) {
    _tag_1 = (double)CONCAT44(uStack_c4,
                              (ugrid->quadTags).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar12]);
    sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(local_148,&tag_1);
    if (sVar6 != 0) {
      lVar7 = (long)*(int *)((long)piVar3 + lVar9 + -8);
      pdVar4 = (ugrid->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_138.points._M_elems[0].pos._M_elems[2] = pdVar4[lVar7 * 3 + 2];
      lVar8 = (long)*(int *)((long)piVar3 + lVar9 + -4);
      local_138.points._M_elems[1].pos._M_elems[0] = pdVar4[lVar8 * 3];
      local_138.points._M_elems[1].pos._M_elems[1] = (pdVar4 + lVar8 * 3)[1];
      local_140 = pdVar4[lVar8 * 3 + 2];
      local_138.points._M_elems[2].pos._M_elems[2] =
           pdVar4[(long)*(int *)((long)piVar3 + lVar9) * 3 + 2];
      local_138.points._M_elems[0].pos._M_elems[0] = pdVar4[lVar7 * 3];
      local_138.points._M_elems[0].pos._M_elems[1] = (pdVar4 + lVar7 * 3)[1];
      local_138.points._M_elems[2].pos._M_elems[0] =
           pdVar4[(long)*(int *)((long)piVar3 + lVar9) * 3];
      local_138.points._M_elems[2].pos._M_elems[1] =
           (pdVar4 + (long)*(int *)((long)piVar3 + lVar9) * 3)[1];
      local_138.points._M_elems[1].pos._M_elems[2] = local_140;
      local_d8 = local_138.points._M_elems[1].pos._M_elems[0];
      dStack_d0 = local_138.points._M_elems[1].pos._M_elems[1];
      std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::emplace_back<Parfait::Facet>
                (this,&local_138);
      pdVar4 = (ugrid->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_138.points._M_elems[2].pos._M_elems[2] =
           pdVar4[(long)*(int *)((long)piVar3 + lVar9) * 3 + 2];
      lVar7 = (long)*(int *)((long)piVar3 + lVar9 + -8);
      local_138.points._M_elems[0].pos._M_elems[2] = pdVar4[lVar7 * 3 + 2];
      local_138.points._M_elems[0].pos._M_elems[0] = pdVar4[lVar7 * 3];
      local_138.points._M_elems[0].pos._M_elems[1] = (pdVar4 + lVar7 * 3)[1];
      local_138.points._M_elems[2].pos._M_elems[0] =
           pdVar4[(long)*(int *)((long)piVar3 + lVar9) * 3];
      local_138.points._M_elems[2].pos._M_elems[1] =
           (pdVar4 + (long)*(int *)((long)piVar3 + lVar9) * 3)[1];
      local_138.points._M_elems[1].pos._M_elems[0] = local_d8;
      local_138.points._M_elems[1].pos._M_elems[1] = dStack_d0;
      local_138.points._M_elems[1].pos._M_elems[2] = local_140;
      std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::emplace_back<Parfait::Facet>
                (this,&local_138);
    }
    lVar9 = lVar9 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

auto cacheSurface(const Parfait::ImportedUgrid& ugrid, const std::set<int>& tags) {
    Parfait::STL::STL stl;
    for(int t = 0; t < ugrid.triangles.size() / 3; t++) {
        auto tri = &ugrid.triangles[3 * t + 0];
        int tag = ugrid.triangleTags[t];
        if (tags.count(tag) != 0) {
            std::array<Parfait::Point<double>, 3> facet;
            for (int i = 0; i < 3; i++) {
                int n = tri[i];
                const double *p = &ugrid.nodes[3 * n + 0];
                facet[i] = Parfait::Point<double>(p[0], p[1], p[2]);
            }
            stl.facets.push_back({facet[0], facet[1], facet[2]});
        }
    }

    for(int q = 0; q < ugrid.quads.size() / 4; q++) {
        auto quad = &ugrid.quads[4 * q + 0];
        int tag = ugrid.quadTags[q];
        if (tags.count(tag) != 0) {
            std::array<Parfait::Point<double>, 3> facet;
            const double *p;
            p = &ugrid.nodes[3 * quad[0] + 0];
            facet[0] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[1] + 0];
            facet[1] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[2] + 0];
            facet[2] = Parfait::Point<double>(p[0], p[1], p[2]);
            stl.facets.push_back({facet[0], facet[1], facet[2]});

            p = &ugrid.nodes[3 * quad[2] + 0];
            facet[2] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[3] + 0];
            facet[3] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[0] + 0];
            facet[0] = Parfait::Point<double>(p[0], p[1], p[2]);
            stl.facets.push_back({facet[0], facet[1], facet[2]});
        }
    }
    return stl;
}